

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O0

Cardinality __thiscall testing::Between(testing *this,int min,int max)

{
  BetweenCardinalityImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Cardinality CVar1;
  int max_local;
  int min_local;
  
  this_00 = (BetweenCardinalityImpl *)operator_new(0x10);
  anon_unknown_6::BetweenCardinalityImpl::BetweenCardinalityImpl(this_00,min,max);
  Cardinality::Cardinality((Cardinality *)this,(CardinalityInterface *)this_00);
  CVar1.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  CVar1.impl_.super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Cardinality)
         CVar1.impl_.
         super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

GTEST_API_ Cardinality Between(int min, int max) {
  return Cardinality(new BetweenCardinalityImpl(min, max));
}